

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.h
# Opt level: O2

void __thiscall
pbrt::RGBFilm::AddSample
          (RGBFilm *this,Point2i *pFilm,SampledSpectrum L,SampledWavelengths *lambda,
          VisibleSurface *param_4,Float weight)

{
  undefined1 auVar1 [16];
  Pixel *pPVar2;
  long lVar3;
  float fVar4;
  undefined1 auVar5 [64];
  undefined1 auVar8 [56];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  initializer_list<float> __l;
  RGB RVar11;
  SampledSpectrum SVar12;
  float local_74;
  undefined1 local_68 [16];
  float local_58;
  SampledSpectrum H;
  undefined8 local_38;
  float local_30;
  SampledSpectrum L_local;
  
  auVar9._8_56_ = L._16_56_;
  auVar9._0_8_ = L.values.values._8_8_;
  auVar5._8_56_ = L._8_56_;
  auVar5._0_8_ = L.values.values._0_8_;
  L_local.values.values = (array<float,_4>)vmovlhps_avx(auVar5._0_16_,auVar9._0_16_);
  auVar8 = (undefined1  [56])0x0;
  SVar12 = SampledSpectrum::operator*(&L_local,((this->super_FilmBase).sensor)->imagingRatio);
  auVar10._0_8_ = SVar12.values.values._8_8_;
  auVar10._8_56_ = auVar9._8_56_;
  auVar6._0_8_ = SVar12.values.values._0_8_;
  auVar6._8_56_ = auVar8;
  H.values.values = (array<float,_4>)vmovlhps_avx(auVar6._0_16_,auVar10._0_16_);
  auVar8 = ZEXT856(H.values.values._8_8_);
  RVar11 = PixelSensor::ToSensorRGB((this->super_FilmBase).sensor,&H,lambda);
  local_74 = RVar11.b;
  auVar7._0_8_ = RVar11._0_8_;
  auVar7._8_56_ = auVar8;
  local_68 = auVar7._0_16_;
  local_38 = vmovlps_avx(local_68);
  __l._M_len = 3;
  __l._M_array = (iterator)&local_38;
  local_30 = local_74;
  fVar4 = std::max<float>(__l);
  auVar1 = vmovshdup_avx(local_68);
  local_58 = auVar1._0_4_;
  if (this->maxComponentValue < fVar4) {
    SampledSpectrum::operator*=(&H,this->maxComponentValue / fVar4);
    local_68._0_4_ = RVar11.r;
    fVar4 = this->maxComponentValue / fVar4;
    local_68 = ZEXT416((uint)((float)local_68._0_4_ * fVar4));
    local_58 = local_58 * fVar4;
    local_74 = local_74 * fVar4;
  }
  pPVar2 = Array2D<pbrt::RGBFilm::Pixel>::operator[]
                     (&this->pixels,(Point2i)pFilm->super_Tuple2<pbrt::Point2,_int>);
  for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
    fVar4 = (float)local_68._0_4_;
    if (((int)lVar3 != 0) && (fVar4 = local_58, (int)lVar3 != 1)) {
      fVar4 = local_74;
    }
    pPVar2->rgbSum[lVar3] = (double)(fVar4 * weight) + pPVar2->rgbSum[lVar3];
  }
  pPVar2->weightSum = (double)weight + pPVar2->weightSum;
  return;
}

Assistant:

PBRT_CPU_GPU
    void AddSample(const Point2i &pFilm, SampledSpectrum L,
                   const SampledWavelengths &lambda, const VisibleSurface *,
                   Float weight) {
        // Convert sample radiance to _PixelSensor_ RGB
        SampledSpectrum H = L * sensor->ImagingRatio();
        RGB rgb = sensor->ToSensorRGB(H, lambda);

        // Optionally clamp sensor RGB value
        Float m = std::max({rgb.r, rgb.g, rgb.b});
        if (m > maxComponentValue) {
            H *= maxComponentValue / m;
            rgb *= maxComponentValue / m;
        }

        DCHECK(InsideExclusive(pFilm, pixelBounds));
        // Update pixel values with filtered sample contribution
        Pixel &pixel = pixels[pFilm];
        for (int c = 0; c < 3; ++c)
            pixel.rgbSum[c] += weight * rgb[c];
        pixel.weightSum += weight;
    }